

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O2

string * __thiscall
BigSudokuVisualizer::createBorderRightStyle_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  uint uVar1;
  uint __val;
  string local_50;
  
  uVar1 = gitter->elements;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  __val = 0xffffffff;
  while( true ) {
    __val = __val + gitter->quadWidth;
    if (uVar1 * uVar1 <= __val) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::to_string(&local_50,__val);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createBorderRightStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int elements = size * size;
    std::string border_right = "";
    for (unsigned int i = gitter.getQuadWidth() - 1; i < elements; i += gitter.getQuadWidth()) {
        border_right.append("#bigCell-");
        border_right.append(std::to_string(i));
        border_right.append(", ");
    }
    border_right = border_right.substr(0, border_right.length() - 2);
    border_right.append(" { border-right: 2px solid #000; } ");
    return border_right;
}